

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIFont.cpp
# Opt level: O0

void __thiscall irr::gui::CGUIFont::~CGUIFont(CGUIFont *this,void **vtt)

{
  undefined8 *in_RSI;
  IGUIFontBitmap *in_RDI;
  IReferenceCounted *in_stack_ffffffffffffffd8;
  
  (in_RDI->super_IGUIFont)._vptr_IGUIFont = (_func_int **)*in_RSI;
  *(undefined8 *)
   ((long)&(in_RDI->super_IGUIFont)._vptr_IGUIFont +
   (long)(in_RDI->super_IGUIFont)._vptr_IGUIFont[-3]) = in_RSI[5];
  if (*(long *)&in_RDI[2].super_IGUIFont.field_0x18 != 0) {
    IReferenceCounted::drop(in_stack_ffffffffffffffd8);
  }
  if (in_RDI[3].super_IGUIFont._vptr_IGUIFont != (_func_int **)0x0) {
    IReferenceCounted::drop(in_stack_ffffffffffffffd8);
  }
  core::string<wchar_t>::~string((string<wchar_t> *)0x3b8e65);
  ::std::map<wchar_t,_int,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_>::
  ~map((map<wchar_t,_int,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_> *)
       0x3b8e73);
  core::array<irr::gui::CGUIFont::SFontArea>::~array
            ((array<irr::gui::CGUIFont::SFontArea> *)0x3b8e81);
  IGUIFontBitmap::~IGUIFontBitmap(in_RDI,&in_stack_ffffffffffffffd8->_vptr_IReferenceCounted);
  return;
}

Assistant:

CGUIFont::~CGUIFont()
{
	if (Driver)
		Driver->drop();

	if (SpriteBank) {
		SpriteBank->drop();
		// TODO: spritebank still exists in gui-environment and should be removed here when it's
		// reference-count is 1. Just can't do that from here at the moment.
		// But spritebank would not be able to drop textures anyway because those are in texture-cache
		// where they can't be removed unless materials start reference-couting 'em.
	}
}